

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall Parser::~Parser(Parser *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_provider).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_includeDirs).d);
  QArrayDataPointer<LineNumber>::~QArrayDataPointer(&(this->m_offsets).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_metadata).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_prefixes).d);
  QArrayDataPointer<Replace>::~QArrayDataPointer(&(this->m_replaces).d);
  QArrayDataPointer<Point>::~QArrayDataPointer(&(this->m_points).d);
  QArrayDataPointer<Function>::~QArrayDataPointer((QArrayDataPointer<Function> *)this);
  return;
}

Assistant:

Parser(const QString &provider)
        : m_provider(provider)
    {

    }